

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O0

void Gia_ManDumpTestsDelay(Vec_Int_t *vTests,int nIter,char *pFileName,Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  FILE *__stream;
  Vec_Int_t *p_00;
  int local_40;
  int nVars;
  int v;
  int i;
  Vec_Int_t *vValues;
  FILE *pFile;
  Gia_Man_t *p_local;
  char *pFileName_local;
  int nIter_local;
  Vec_Int_t *vTests_local;
  
  __stream = fopen(pFileName,"wb");
  iVar1 = Gia_ManCiNum(p);
  p_00 = Vec_IntAlloc(iVar1);
  iVar1 = Vec_IntSize(vTests);
  iVar1 = iVar1 / nIter;
  iVar2 = Vec_IntSize(vTests);
  if (iVar2 % nIter != 0) {
    __assert_fail("Vec_IntSize(vTests) % nIter == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                  ,0x353,"void Gia_ManDumpTestsDelay(Vec_Int_t *, int, char *, Gia_Man_t *)");
  }
  iVar2 = Gia_ManPiNum(p);
  iVar3 = Gia_ManRegNum(p);
  if (iVar1 == iVar2 * 2 + iVar3) {
    for (nVars = 0; nVars < nIter; nVars = nVars + 1) {
      Vec_IntClear(p_00);
      local_40 = Gia_ManRegNum(p);
      while( true ) {
        iVar2 = Gia_ManCiNum(p);
        if (iVar2 <= local_40) break;
        uVar4 = Vec_IntEntry(vTests,nVars * iVar1 + local_40);
        fprintf(__stream,"%d",(ulong)uVar4);
        iVar2 = Vec_IntEntry(vTests,nVars * iVar1 + local_40);
        Vec_IntPush(p_00,iVar2);
        local_40 = local_40 + 1;
      }
      local_40 = 0;
      while( true ) {
        iVar2 = Gia_ManRegNum(p);
        if (iVar2 <= local_40) break;
        uVar4 = Vec_IntEntry(vTests,nVars * iVar1 + local_40);
        fprintf(__stream,"%d",(ulong)uVar4);
        iVar2 = Vec_IntEntry(vTests,nVars * iVar1 + local_40);
        Vec_IntPush(p_00,iVar2);
        local_40 = local_40 + 1;
      }
      fprintf(__stream,"\n");
      Gia_ManDumpTestsSimulate(p,p_00);
      for (local_40 = Gia_ManCiNum(p); local_40 < iVar1; local_40 = local_40 + 1) {
        uVar4 = Vec_IntEntry(vTests,nVars * iVar1 + local_40);
        fprintf(__stream,"%d",(ulong)uVar4);
      }
      local_40 = 0;
      while( true ) {
        iVar2 = Vec_IntSize(p_00);
        if (iVar2 <= local_40) break;
        uVar4 = Vec_IntEntry(p_00,local_40);
        fprintf(__stream,"%d",(ulong)uVar4);
        local_40 = local_40 + 1;
      }
      fprintf(__stream,"\n");
    }
    Gia_ManCleanMark0(p);
    fclose(__stream);
    Vec_IntFree(p_00);
    return;
  }
  __assert_fail("nVars == 2 * Gia_ManPiNum(p) + Gia_ManRegNum(p)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                ,0x354,"void Gia_ManDumpTestsDelay(Vec_Int_t *, int, char *, Gia_Man_t *)");
}

Assistant:

void Gia_ManDumpTestsDelay( Vec_Int_t * vTests, int nIter, char * pFileName, Gia_Man_t * p )
{
    FILE * pFile = fopen( pFileName, "wb" );
    Vec_Int_t * vValues = Vec_IntAlloc( Gia_ManCiNum(p) );
    int i, v, nVars = Vec_IntSize(vTests) / nIter;
    assert( Vec_IntSize(vTests) % nIter == 0 );
    assert( nVars == 2 * Gia_ManPiNum(p) + Gia_ManRegNum(p) );
    for ( i = 0; i < nIter; i++ )
    {
        // collect PIs followed by flops
        Vec_IntClear( vValues );
        for ( v = Gia_ManRegNum(p); v < Gia_ManCiNum(p); v++ )
        {
            fprintf( pFile, "%d", Vec_IntEntry(vTests, i * nVars + v) );
            Vec_IntPush( vValues, Vec_IntEntry(vTests, i * nVars + v) );
        }
        for ( v = 0; v < Gia_ManRegNum(p); v++ )
        {
            fprintf( pFile, "%d", Vec_IntEntry(vTests, i * nVars + v) );
            Vec_IntPush( vValues, Vec_IntEntry(vTests, i * nVars + v) );
        }
        fprintf( pFile, "\n" );
        // derive next-state values
        Gia_ManDumpTestsSimulate( p, vValues );
        // collect PIs followed by flops
        for ( v = Gia_ManCiNum(p); v < nVars; v++ )
            fprintf( pFile, "%d", Vec_IntEntry(vTests, i * nVars + v) );
        for ( v = 0; v < Vec_IntSize(vValues); v++ )
            fprintf( pFile, "%d", Vec_IntEntry(vValues, v) );
        fprintf( pFile, "\n" );
    }
    Gia_ManCleanMark0(p);
    fclose( pFile );
    Vec_IntFree( vValues );
}